

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxConversion.cpp
# Opt level: O2

Variant * Jinx::Impl::ParseValue(Variant *__return_storage_ptr__,String *value,NumericFormat format)

{
  bool bVar1;
  bool boolean;
  double number;
  int64_t integer;
  Guid guid;
  bool local_39;
  double local_38;
  int64_t local_30;
  Guid local_28;
  
  bVar1 = StringToGuid(value,&local_28);
  if (bVar1) {
    Variant::Variant(__return_storage_ptr__,&local_28);
  }
  else {
    bVar1 = StringToInteger(value,&local_30);
    if (bVar1) {
      Variant::Variant(__return_storage_ptr__,local_30);
    }
    else {
      bVar1 = StringToNumber(value,&local_38,format);
      if (bVar1) {
        Variant::Variant(__return_storage_ptr__,local_38);
      }
      else {
        bVar1 = StringToBoolean(value,&local_39);
        if (bVar1) {
          Variant::Variant(__return_storage_ptr__,local_39);
        }
        else {
          Variant::Variant(__return_storage_ptr__,value);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant ParseValue(const String & value, NumericFormat format)
	{
		Guid guid;
		if (StringToGuid(value, &guid))
			return guid;
		int64_t integer;
		if (StringToInteger(value, &integer))
			return integer;
		double number;
		if (StringToNumber(value, &number, format))
			return number;
		bool boolean;
		if (StringToBoolean(value, &boolean))
			return boolean;
		return value;
	}